

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argengine.cpp
# Opt level: O2

shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> __thiscall
juzzlin::Argengine::Impl::addOptionCommon<std::function<void(std::__cxx11::string)>>
          (Impl *this,OptionSet *optionVariants,
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *callback,bool required,string *infoText)

{
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> *optionDefinition;
  shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> sVar1;
  OptionDefinitionSP existing;
  undefined1 local_41;
  OptionDefinition *local_40;
  
  local_41 = SUB81(infoText,0);
  getOptionDefinition((Impl *)&stack0xffffffffffffffc0,optionVariants);
  if (local_40 == (OptionDefinition *)0x0) {
    std::
    make_shared<juzzlin::Argengine::Impl::OptionDefinition,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>const&,std::function<void(std::__cxx11::string)>&,bool&,std::__cxx11::string_const&>
              ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this,callback,(bool *)CONCAT71(in_register_00000009,required),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_41);
    std::
    vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
    ::push_back((vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
                 *)&optionVariants[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                (value_type *)this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
    sVar1.super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = extraout_RDX._M_pi;
    sVar1.super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)this;
    return (shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>)
           sVar1.
           super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
    ;
  }
  throwOptionExistingError((Impl *)optionVariants,local_40);
}

Assistant:

std::shared_ptr<OptionDefinition> addOptionCommon(const OptionSet & optionVariants, CallbackType callback, bool required, const std::string & infoText)
    {
        if (const auto existing = getOptionDefinition(optionVariants)) {
            throwOptionExistingError(*existing);
        } else {
            const auto optionDefinition = std::make_shared<OptionDefinition>(optionVariants, callback, required, infoText);
            m_optionDefinitions.push_back(optionDefinition);
            return optionDefinition;
        }
    }